

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::Copy
          (TPZSkylMatrix<std::complex<double>_> *this,TPZSkylMatrix<std::complex<double>_> *A)

{
  complex<double> *pcVar1;
  long lVar2;
  int64_t iVar3;
  complex<double> **ppcVar4;
  long *in_RSI;
  long in_RDI;
  complex<double> *firstp;
  int64_t i;
  int64_t dimension;
  TPZVec<std::complex<double>_> *in_stack_ffffffffffffffb8;
  TPZVec<std::complex<double>_> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  complex<double> *pcVar5;
  complex<double> *pcVar6;
  TPZVec<std::complex<double>_*> *in_stack_ffffffffffffffe0;
  long index;
  
  lVar2 = (**(code **)(*in_RSI + 0x60))();
  *(long *)(in_RDI + 0x10) = lVar2;
  *(long *)(in_RDI + 8) = lVar2;
  TPZVec<std::complex<double>_*>::NElements((TPZVec<std::complex<double>_*> *)(in_RSI + 4));
  TPZVec<std::complex<double>_*>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<std::complex<double>_>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pcVar5 = (complex<double> *)0x0;
  iVar3 = TPZVec<std::complex<double>_>::NElements((TPZVec<std::complex<double>_> *)(in_RDI + 0x40))
  ;
  if (iVar3 != 0) {
    pcVar5 = TPZVec<std::complex<double>_>::operator[]
                       ((TPZVec<std::complex<double>_> *)(in_RDI + 0x40),0);
  }
  for (index = 0; index <= lVar2; index = index + 1) {
    pcVar6 = pcVar5;
    ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                        ((TPZVec<std::complex<double>_*> *)(in_RSI + 4),index);
    pcVar1 = *ppcVar4;
    ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                        ((TPZVec<std::complex<double>_*> *)(in_RSI + 4),0);
    pcVar5 = pcVar5 + ((long)pcVar1 - (long)*ppcVar4 >> 4);
    ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                        ((TPZVec<std::complex<double>_*> *)(in_RDI + 0x20),index);
    *ppcVar4 = pcVar5;
    pcVar5 = pcVar6;
  }
  *(char *)(in_RDI + 0x18) = (char)in_RSI[3];
  *(undefined1 *)(in_RDI + 0x19) = *(undefined1 *)((long)in_RSI + 0x19);
  return;
}

Assistant:

void
TPZSkylMatrix<TVar>::Copy(const TPZSkylMatrix<TVar> &A )
{
    int64_t dimension = A.Dim();
    this->fRow = this->fCol = dimension;
    fElem.Resize(A.fElem.NElements());
    fStorage = A.fStorage;
    int64_t i;
    TVar *firstp = 0;
    if(fStorage.NElements()) firstp = &fStorage[0];
    for(i=0; i<=dimension; i++)
        fElem[i]=firstp+(A.fElem[i]-A.fElem[0]);
    this->fDecomposed  = A.fDecomposed;
    this->fDefPositive = A.fDefPositive;
    
}